

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O1

bool __thiscall SimpleLoggerMgr::chkExitOnCrash(SimpleLoggerMgr *this)

{
  int iVar1;
  char *__s;
  bool bVar2;
  string env_segv_str;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  bVar2 = true;
  if (this->exitOnCrash == false) {
    local_28 = 0;
    local_20[0] = 0;
    local_30 = local_20;
    __s = getenv("SIMPLELOGGER_EXIT_ON_CRASH");
    if (__s != (char *)0x0) {
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&local_30,0,(char *)0x0,(ulong)__s);
    }
    iVar1 = std::__cxx11::string::compare((char *)&local_30);
    bVar2 = true;
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)&local_30);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)&local_30);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)&local_30);
          bVar2 = iVar1 == 0;
        }
      }
    }
    if (local_30 != local_20) {
      operator_delete(local_30);
    }
  }
  return bVar2;
}

Assistant:

bool SimpleLoggerMgr::chkExitOnCrash() {
    if (exitOnCrash) return true;

    std::string env_segv_str;
    const char* env_segv = std::getenv("SIMPLELOGGER_EXIT_ON_CRASH");
    if (env_segv) env_segv_str = env_segv;

    if ( env_segv_str == "ON" ||
         env_segv_str == "on" ||
         env_segv_str == "TRUE" ||
         env_segv_str == "true" ) {
        // Manually turned off by user, via env var.
        return true;
    }

    return false;
}